

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_reserve_success_enoughCapacityBufferNotNull_fn(int _i)

{
  bool bVar1;
  size_t sVar2;
  void *_ck_x_6;
  intmax_t _ck_y_4;
  intmax_t _ck_x_5;
  intmax_t _ck_y_3;
  intmax_t _ck_x_4;
  void *_ck_x_3;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray array;
  size_t i;
  int _i_local;
  
  memcpy(&_ck_x,&PTR_private_ACUtilsTest_ADynArray_realloc_001a6ad0,0x30);
  array.growStrategy = (ACUtilsGrowStrategy)0x8;
  array.deallocator = (ACUtilsDeallocator)0x0;
  array.size = 8;
  private_ACUtilsTest_ADynArray_reallocFail = false;
  array.capacity = (*(code *)_ck_x)(0,8);
  for (array.buffer = (char *)0x0; array.buffer < array.growStrategy + -1;
      array.buffer = array.buffer + 1) {
    array.buffer[array.capacity] = '5';
  }
  array.growStrategy[array.capacity - 1] = (_func_size_t_size_t_size_t)0x30;
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = true;
  bVar1 = private_ACUtils_ADynArray_reserve(&_ck_x,array.size,false,1);
  if ((ulong)bVar1 != 1) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xca,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer)) == true"
                      ,
                      "private_ACUtils_ADynArray_reserve(&array, array.capacity, false, sizeof(*(&array)->buffer))"
                      ,(ulong)bVar1,"true",1,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0xca);
  if (array.growStrategy != (ACUtilsGrowStrategy)0x8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xcb,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "array.size == private_ACUtilsTest_ADynArray_capacityMin","array.size",
                      array.growStrategy,"private_ACUtilsTest_ADynArray_capacityMin",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0xcb);
  if (array.size == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xcc);
    if (array.capacity == 0) {
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xcd,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x","(void*) array.buffer != NULL",
                        "(void*) array.buffer",0,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xcd);
    for (array.buffer = (char *)0x0; array.buffer < (char *)0x7; array.buffer = array.buffer + 1) {
      if ((long)array.buffer[array.capacity] != 0x35) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0xcf,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %jd, %s == %jd","array.buffer[i] == \'5\'"
                          ,"array.buffer[i]",(long)array.buffer[array.capacity],"\'5\'",0x35,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xcf);
    }
    if ((long)*(char *)(array.capacity + 7) != 0x30) {
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xd0,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                        "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'",
                        "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]",
                        (long)*(char *)(array.capacity + 7),"\'0\'",0x30,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xd0);
    if (array.deallocator == (ACUtilsDeallocator)0x0) {
      sVar2 = 0xd1;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xd1);
      (*array.reallocator)((void *)array.capacity,sVar2);
      return;
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xd1,"Assertion \'_ck_x == NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) array.growStrategy == NULL",
                      "(void*) array.growStrategy",array.deallocator,0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0xcc,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                    "array.capacity == private_ACUtilsTest_ADynArray_capacityMin","array.capacity",
                    array.size,"private_ACUtilsTest_ADynArray_capacityMin",8,0);
}

Assistant:

START_TEST(test_ADynArray_reserve_success_enoughCapacityBufferNotNull)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = nullptr;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, array.capacity), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NULL(array.growStrategy);
    array.deallocator(array.buffer);
}